

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::InsertDebugLabel
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Char *Label,float *pColor,
          int param_3)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  int param_3_local;
  float *pColor_local;
  Char *Label_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  if (Label == (Char *)0x0) {
    msg.field_2._12_4_ = param_3;
    FormatString<char[23]>((string *)local_48,(char (*) [23])"Label must not be null");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"InsertDebugLabel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x847);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::InsertDebugLabel(const Char* Label, const float* pColor, int) const
{
    DEV_CHECK_ERR(Label != nullptr, "Label must not be null");
}